

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::InternReadFile
          (OpenGEXImporter *this,string *filename,aiScene *pScene,IOSystem *pIOHandler)

{
  bool bVar1;
  IOStream *pIVar2;
  DeadlyImportError *this_00;
  reference buffer_00;
  size_type len;
  Context *pCVar3;
  aiNode *this_01;
  undefined1 local_e8 [7];
  bool success;
  OpenDDLParser myParser;
  vector<char,_std::allocator<char>_> buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator local_51;
  string local_50;
  IOStream *local_30;
  IOStream *file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *filename_local;
  OpenGEXImporter *this_local;
  
  file = (IOStream *)pIOHandler;
  pIOHandler_local = (IOSystem *)pScene;
  pScene_local = (aiScene *)filename;
  filename_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"rb",&local_51);
  pIVar2 = IOSystem::Open(pIOHandler,filename,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = pIVar2;
  if (pIVar2 == (IOStream *)0x0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_88,"Failed to open file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pScene_local
                  );
    DeadlyImportError::DeadlyImportError(this_00,&local_88);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&myParser.m_context);
  BaseImporter::TextFileToBuffer
            (local_30,(vector<char,_std::allocator<char>_> *)&myParser.m_context,FORBID_EMPTY);
  (*file->_vptr_IOStream[5])(file,local_30);
  ODDLParser::OpenDDLParser::OpenDDLParser((OpenDDLParser *)local_e8);
  buffer_00 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)&myParser.m_context,0);
  len = std::vector<char,_std::allocator<char>_>::size
                  ((vector<char,_std::allocator<char>_> *)&myParser.m_context);
  ODDLParser::OpenDDLParser::setBuffer((OpenDDLParser *)local_e8,buffer_00,len);
  bVar1 = ODDLParser::OpenDDLParser::parse((OpenDDLParser *)local_e8);
  if (bVar1) {
    pCVar3 = ODDLParser::OpenDDLParser::getContext((OpenDDLParser *)local_e8);
    this->m_ctx = pCVar3;
    this_01 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_01);
    (pIOHandler_local->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this_01;
    aiString::Set((aiString *)
                  (pIOHandler_local->m_pathStack).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,(string *)pScene_local);
    handleNodes(this,this->m_ctx->m_root,(aiScene *)pIOHandler_local);
  }
  copyMeshes(this,(aiScene *)pIOHandler_local);
  copyCameras(this,(aiScene *)pIOHandler_local);
  copyLights(this,(aiScene *)pIOHandler_local);
  copyMaterials(this,(aiScene *)pIOHandler_local);
  resolveReferences(this);
  createNodeTree(this,(aiScene *)pIOHandler_local);
  ODDLParser::OpenDDLParser::~OpenDDLParser((OpenDDLParser *)local_e8);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)&myParser.m_context);
  return;
}

Assistant:

void OpenGEXImporter::InternReadFile( const std::string &filename, aiScene *pScene, IOSystem *pIOHandler ) {
    // open source file
    IOStream *file = pIOHandler->Open( filename, "rb" );
    if( !file ) {
        throw DeadlyImportError( "Failed to open file " + filename );
    }

    std::vector<char> buffer;
    TextFileToBuffer( file, buffer );
    pIOHandler->Close( file );

    OpenDDLParser myParser;
    myParser.setBuffer( &buffer[ 0 ], buffer.size() );
    bool success( myParser.parse() );
    if( success ) {
        m_ctx = myParser.getContext();
        pScene->mRootNode = new aiNode;
        pScene->mRootNode->mName.Set( filename );
        handleNodes( m_ctx->m_root, pScene );
    }

    copyMeshes( pScene );
    copyCameras( pScene );
    copyLights( pScene );
    copyMaterials( pScene );
    resolveReferences();
    createNodeTree( pScene );
}